

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O0

bool dxil_spv::emit_write_sampler_feedback_instruction(Op opcode,Impl *impl,CallInst *instruction)

{
  CallInst *pCVar1;
  bool bVar2;
  Id IVar3;
  Id component;
  Id component_00;
  Id type_id;
  Id type1;
  Id type_id_00;
  Id IVar4;
  Id mip_region_size_log2_00;
  Id IVar5;
  Value *pVVar6;
  Operation *pOVar7;
  Operation *pOVar8;
  Operation *pOVar9;
  Operation *pOVar10;
  Operation *pOVar11;
  LodSelection LVar12;
  ScalingFactors SVar13;
  Id local_25c;
  Operation *call;
  Id call_id;
  HelperCall helper_call;
  Operation *trilinear_and;
  Operation *not_op;
  Operation *is_helper;
  Id participate_id;
  Operation *comp;
  Id comp_id;
  Operation *shift_op;
  Operation *shamt64;
  Operation *shamt;
  Operation *u64_conv;
  Id u64_type;
  Operation *or_op;
  Operation *select_op;
  Id local_1a8;
  uint i_1;
  Id merged_bit;
  Id bit_ids [3];
  Operation *visit_diag;
  Operation *visit_vert;
  Operation *visit_horiz;
  Operation *not_equal;
  Operation *hi_int;
  Operation *lo_int;
  Operation *hi_foot_print;
  Operation *lo_clamped;
  Operation *lo_foot_print;
  Operation *min_extent;
  Operation *clamped_extent;
  Operation *fextent;
  Operation *shift_exp;
  Operation *sclamp;
  Operation *extract;
  Operation *frexp;
  Operation *rounding_bias;
  Operation *scale_size;
  Id clamped_extent_id;
  Operation *mul_mip_region_coord;
  Id local_f0;
  Id local_e4;
  Id IStack_e0;
  ScalingFactors scaling;
  Id lod_id;
  uint lod_iteration;
  Operation *fract_uv_op;
  Id normalized_grad_extent;
  Id local_b8;
  Id local_ac;
  Id IStack_a8;
  LodSelection lods;
  Id access_lod_id;
  Id grad_scale_id;
  Id max_level_id;
  Id mip_region_size_log2;
  Id coord_id;
  uint32_t i;
  Id coord_ids [2];
  Operation *int_layer;
  Operation *rounded_layer;
  Id int_layer_id;
  Id fvec_type;
  Id ivec_type;
  Id bvec_type;
  Id f32_type;
  Id i32_type;
  Id bool_type;
  uint32_t num_coords;
  uint32_t num_coords_full;
  mapped_type *meta;
  Id local_38;
  Id sampler_id;
  Id image_id;
  Id feedback_id;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  Op opcode_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  impl_local._0_4_ = opcode;
  _image_id = Converter::Impl::builder(impl);
  spv::Builder::addCapability(_image_id,CapabilityImageQuery);
  if ((int)instruction_local[0x16].super_Instruction.attachments._M_h._M_element_count == 0) {
    IVar3 = spv::Builder::import(_image_id,"GLSL.std.450");
    *(Id *)&instruction_local[0x16].super_Instruction.attachments._M_h._M_element_count = IVar3;
  }
  pCVar1 = instruction_local;
  pVVar6 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
  sampler_id = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar6,0);
  pCVar1 = instruction_local;
  pVVar6 = LLVMBC::Instruction::getOperand((Instruction *)builder,2);
  local_38 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar6,0);
  pCVar1 = instruction_local;
  pVVar6 = LLVMBC::Instruction::getOperand((Instruction *)builder,3);
  meta._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar6,0);
  _num_coords = std::
                unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                              *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                 _M_rehash_policy._M_next_resize,&sampler_id);
  bool_type = 0;
  i32_type = 0;
  bVar2 = get_image_dimensions((Impl *)instruction_local,local_38,&bool_type,&i32_type);
  if (bVar2) {
    if (i32_type == 2) {
      IVar3 = spv::Builder::makeBoolType(_image_id);
      component = spv::Builder::makeIntType(_image_id,0x20);
      component_00 = spv::Builder::makeFloatType(_image_id,0x20);
      type_id = spv::Builder::makeVectorType(_image_id,IVar3,2);
      type1 = spv::Builder::makeVectorType(_image_id,component,2);
      type_id_00 = spv::Builder::makeVectorType(_image_id,component_00,2);
      rounded_layer._4_4_ = 0;
      if (bool_type == 3) {
        pOVar7 = Converter::Impl::allocate((Impl *)instruction_local,OpExtInst,component_00);
        Operation::add_id(pOVar7,(Id)instruction_local[0x16].super_Instruction.attachments._M_h.
                                     _M_element_count);
        Operation::add_literal(pOVar7,2);
        pCVar1 = instruction_local;
        pVVar6 = LLVMBC::Instruction::getOperand((Instruction *)builder,6);
        IVar4 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar6,0);
        Operation::add_id(pOVar7,IVar4);
        Converter::Impl::add((Impl *)instruction_local,pOVar7,false);
        coord_ids = (Id  [2])Converter::Impl::allocate
                                       ((Impl *)instruction_local,OpConvertFToS,component);
        Operation::add_id((Operation *)coord_ids,pOVar7->id);
        Converter::Impl::add((Impl *)instruction_local,(Operation *)coord_ids,false);
        rounded_layer._4_4_ = *(Id *)((long)coord_ids + 4);
      }
      for (mip_region_size_log2 = 0; pCVar1 = instruction_local, mip_region_size_log2 < 2;
          mip_region_size_log2 = mip_region_size_log2 + 1) {
        pVVar6 = LLVMBC::Instruction::getOperand((Instruction *)builder,mip_region_size_log2 + 4);
        IVar4 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar6,0);
        (&coord_id)[mip_region_size_log2] = IVar4;
      }
      IVar4 = Converter::Impl::build_vector((Impl *)instruction_local,component_00,&coord_id,2);
      mip_region_size_log2_00 =
           emit_mip_region_size_log2
                     ((Impl *)instruction_local,(CallInst *)builder,sampler_id,bool_type == 3);
      IVar5 = emit_max_level((Impl *)instruction_local,local_38);
      lods.coarse_lod_id =
           emit_accessed_lod((Op)impl_local,(Impl *)instruction_local,(CallInst *)builder,local_38,
                             meta._4_4_,IVar4,IVar5,&lods.trilinear_enable_id,bool_type == 3);
      LVar12 = emit_trilinear_lods((Impl *)instruction_local,lods.coarse_lod_id,IVar5);
      local_b8 = LVar12.trilinear_enable_id;
      lods.fine_lod_id = local_b8;
      fract_uv_op._4_4_ = 0;
      if (((Op)impl_local == WriteSamplerFeedback) || ((Op)impl_local == WriteSamplerFeedbackBias))
      {
        fract_uv_op._4_4_ =
             emit_gradient_extent_normalized
                       ((Impl *)instruction_local,IVar4,lods.trilinear_enable_id);
      }
      pOVar7 = Converter::Impl::allocate((Impl *)instruction_local,OpExtInst,type_id_00);
      Operation::add_id(pOVar7,(Id)instruction_local[0x16].super_Instruction.attachments._M_h.
                                   _M_element_count);
      Operation::add_literal(pOVar7,10);
      Operation::add_id(pOVar7,IVar4);
      Converter::Impl::add((Impl *)instruction_local,pOVar7,false);
      for (scaling.unnormalized_exponent_id = 0; scaling.unnormalized_exponent_id < 2;
          scaling.unnormalized_exponent_id = scaling.unnormalized_exponent_id + 1) {
        if (scaling.unnormalized_exponent_id == 0) {
          local_ac = LVar12.fine_lod_id;
          local_25c = local_ac;
        }
        else {
          IStack_a8 = LVar12.coarse_lod_id;
          local_25c = IStack_a8;
        }
        SVar13 = emit_scaling_factor_to_mip_region_space
                           ((Impl *)instruction_local,(CallInst *)builder,local_38,local_25c,
                            mip_region_size_log2_00,bool_type == 3);
        local_f0 = SVar13.unnormalized_exponent_id;
        pOVar8 = Converter::Impl::allocate((Impl *)instruction_local,OpFMul,type_id_00);
        Operation::add_id(pOVar8,pOVar7->id);
        local_e4 = SVar13.normalized_scale_id;
        Operation::add_id(pOVar8,local_e4);
        Converter::Impl::add((Impl *)instruction_local,pOVar8,false);
        if (((Op)impl_local == WriteSamplerFeedback) || ((Op)impl_local == WriteSamplerFeedbackBias)
           ) {
          pOVar9 = Converter::Impl::allocate((Impl *)instruction_local,OpFMul,type_id_00);
          Operation::add_id(pOVar9,fract_uv_op._4_4_);
          IStack_e0 = SVar13.float_size_id;
          Operation::add_id(pOVar9,IStack_e0);
          Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
          pOVar10 = Converter::Impl::allocate((Impl *)instruction_local,OpFSub,type_id_00);
          Operation::add_id(pOVar10,pOVar9->id);
          pCVar1 = instruction_local;
          IVar4 = spv::Builder::makeFloatConstant(_image_id,0.00390625,false);
          IVar4 = Converter::Impl::build_splat_constant_vector((Impl *)pCVar1,component_00,IVar4,2);
          Operation::add_id(pOVar10,IVar4);
          Converter::Impl::add((Impl *)instruction_local,pOVar10,false);
          pCVar1 = instruction_local;
          IVar4 = spv::Builder::makeStructResultType(_image_id,type_id_00,type1);
          pOVar9 = Converter::Impl::allocate((Impl *)pCVar1,OpExtInst,IVar4);
          Operation::add_id(pOVar9,(Id)instruction_local[0x16].super_Instruction.attachments._M_h.
                                       _M_element_count);
          Operation::add_literal(pOVar9,0x34);
          Operation::add_id(pOVar9,pOVar10->id);
          Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
          pOVar10 = Converter::Impl::allocate((Impl *)instruction_local,OpCompositeExtract,type1);
          Operation::add_id(pOVar10,pOVar9->id);
          Operation::add_literal(pOVar10,1);
          Converter::Impl::add((Impl *)instruction_local,pOVar10,false);
          pOVar9 = Converter::Impl::allocate((Impl *)instruction_local,OpExtInst,type1);
          Operation::add_id(pOVar9,(Id)instruction_local[0x16].super_Instruction.attachments._M_h.
                                       _M_element_count);
          Operation::add_literal(pOVar9,0x2d);
          Operation::add_id(pOVar9,pOVar10->id);
          pCVar1 = instruction_local;
          IVar4 = spv::Builder::makeIntConstant(_image_id,0,false);
          IVar4 = Converter::Impl::build_splat_constant_vector
                            ((Impl *)pCVar1,component,IVar4,i32_type);
          Operation::add_id(pOVar9,IVar4);
          pCVar1 = instruction_local;
          IVar4 = spv::Builder::makeIntConstant(_image_id,4,false);
          IVar4 = Converter::Impl::build_splat_constant_vector
                            ((Impl *)pCVar1,component,IVar4,i32_type);
          Operation::add_id(pOVar9,IVar4);
          Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
          pOVar10 = Converter::Impl::allocate((Impl *)instruction_local,OpIAdd,type1);
          Operation::add_id(pOVar10,pOVar9->id);
          Operation::add_id(pOVar10,local_f0);
          Converter::Impl::add((Impl *)instruction_local,pOVar10,false);
          pOVar9 = Converter::Impl::allocate((Impl *)instruction_local,OpExtInst,type_id_00);
          Operation::add_id(pOVar9,(Id)instruction_local[0x16].super_Instruction.attachments._M_h.
                                       _M_element_count);
          Operation::add_literal(pOVar9,0x35);
          pCVar1 = instruction_local;
          IVar4 = spv::Builder::makeFloatConstant(_image_id,0.5,false);
          IVar4 = Converter::Impl::build_splat_constant_vector
                            ((Impl *)pCVar1,component_00,IVar4,i32_type);
          Operation::add_id(pOVar9,IVar4);
          Operation::add_id(pOVar9,pOVar10->id);
          Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
          pOVar10 = Converter::Impl::allocate((Impl *)instruction_local,OpExtInst,type_id_00);
          Operation::add_id(pOVar10,(Id)instruction_local[0x16].super_Instruction.attachments._M_h.
                                        _M_element_count);
          Operation::add_literal(pOVar10,0x25);
          Operation::add_id(pOVar10,pOVar9->id);
          pCVar1 = instruction_local;
          IVar4 = spv::Builder::makeFloatConstant(_image_id,0.5,false);
          IVar4 = Converter::Impl::build_splat_constant_vector
                            ((Impl *)pCVar1,component_00,IVar4,i32_type);
          Operation::add_id(pOVar10,IVar4);
          Converter::Impl::add((Impl *)instruction_local,pOVar10,false);
          scale_size._4_4_ = pOVar10->id;
        }
        else {
          pOVar9 = Converter::Impl::allocate((Impl *)instruction_local,OpExtInst,type_id_00);
          Operation::add_id(pOVar9,(Id)instruction_local[0x16].super_Instruction.attachments._M_h.
                                       _M_element_count);
          Operation::add_literal(pOVar9,0x35);
          pCVar1 = instruction_local;
          IVar4 = spv::Builder::makeFloatConstant(_image_id,0.5,false);
          IVar4 = Converter::Impl::build_splat_constant_vector
                            ((Impl *)pCVar1,component_00,IVar4,i32_type);
          Operation::add_id(pOVar9,IVar4);
          Operation::add_id(pOVar9,local_f0);
          Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
          scale_size._4_4_ = pOVar9->id;
        }
        pOVar9 = Converter::Impl::allocate((Impl *)instruction_local,OpFSub,type_id_00);
        Operation::add_id(pOVar9,pOVar8->id);
        Operation::add_id(pOVar9,scale_size._4_4_);
        Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
        pOVar10 = Converter::Impl::allocate((Impl *)instruction_local,OpExtInst,type_id_00);
        Operation::add_id(pOVar10,(Id)instruction_local[0x16].super_Instruction.attachments._M_h.
                                      _M_element_count);
        Operation::add_literal(pOVar10,0x28);
        Operation::add_id(pOVar10,pOVar9->id);
        pCVar1 = instruction_local;
        IVar4 = spv::Builder::makeFloatConstant(_image_id,0.0,false);
        IVar4 = Converter::Impl::build_splat_constant_vector
                          ((Impl *)pCVar1,component_00,IVar4,i32_type);
        Operation::add_id(pOVar10,IVar4);
        Converter::Impl::add((Impl *)instruction_local,pOVar10,false);
        pOVar9 = Converter::Impl::allocate((Impl *)instruction_local,OpFAdd,type_id_00);
        Operation::add_id(pOVar9,pOVar8->id);
        Operation::add_id(pOVar9,scale_size._4_4_);
        Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
        pOVar8 = Converter::Impl::allocate((Impl *)instruction_local,OpConvertFToS,type1);
        Operation::add_id(pOVar8,pOVar10->id);
        Converter::Impl::add((Impl *)instruction_local,pOVar8,false);
        pOVar10 = Converter::Impl::allocate((Impl *)instruction_local,OpConvertFToS,type1);
        Operation::add_id(pOVar10,pOVar9->id);
        Converter::Impl::add((Impl *)instruction_local,pOVar10,false);
        pOVar9 = Converter::Impl::allocate((Impl *)instruction_local,OpINotEqual,type_id);
        Operation::add_id(pOVar9,pOVar8->id);
        Operation::add_id(pOVar9,pOVar10->id);
        Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
        pOVar10 = Converter::Impl::allocate((Impl *)instruction_local,OpCompositeExtract,IVar3);
        Operation::add_id(pOVar10,pOVar9->id);
        Operation::add_literal(pOVar10,0);
        Converter::Impl::add((Impl *)instruction_local,pOVar10,false);
        pOVar11 = Converter::Impl::allocate((Impl *)instruction_local,OpCompositeExtract,IVar3);
        Operation::add_id(pOVar11,pOVar9->id);
        Operation::add_literal(pOVar11,1);
        Converter::Impl::add((Impl *)instruction_local,pOVar11,false);
        bit_ids._4_8_ = Converter::Impl::allocate((Impl *)instruction_local,OpLogicalAnd,IVar3);
        Operation::add_id((Operation *)bit_ids._4_8_,pOVar10->id);
        Operation::add_id((Operation *)bit_ids._4_8_,pOVar11->id);
        Converter::Impl::add((Impl *)instruction_local,(Operation *)bit_ids._4_8_,false);
        i_1 = pOVar10->id;
        merged_bit = pOVar11->id;
        bit_ids[0] = *(Id *)(bit_ids._4_8_ + 4);
        local_1a8 = spv::Builder::makeIntConstant(_image_id,1,false);
        for (select_op._4_4_ = 0; select_op._4_4_ < 3; select_op._4_4_ = select_op._4_4_ + 1) {
          pOVar9 = Converter::Impl::allocate((Impl *)instruction_local,OpSelect,component);
          Operation::add_id(pOVar9,(&i_1)[select_op._4_4_]);
          IVar4 = spv::Builder::makeIntConstant(_image_id,2 << ((byte)select_op._4_4_ & 0x1f),false)
          ;
          Operation::add_id(pOVar9,IVar4);
          IVar4 = spv::Builder::makeIntConstant(_image_id,0,false);
          Operation::add_id(pOVar9,IVar4);
          Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
          pOVar10 = Converter::Impl::allocate((Impl *)instruction_local,OpBitwiseOr,component);
          Operation::add_id(pOVar10,local_1a8);
          Operation::add_id(pOVar10,pOVar9->id);
          Converter::Impl::add((Impl *)instruction_local,pOVar10,false);
          local_1a8 = pOVar10->id;
        }
        IVar4 = spv::Builder::makeUintType(_image_id,0x40);
        pOVar9 = Converter::Impl::allocate((Impl *)instruction_local,OpSConvert,IVar4);
        Operation::add_id(pOVar9,local_1a8);
        Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
        pOVar10 = Converter::Impl::allocate((Impl *)instruction_local,OpIMul,component);
        Operation::add_id(pOVar10,local_25c);
        IVar5 = spv::Builder::makeIntConstant(_image_id,4,false);
        Operation::add_id(pOVar10,IVar5);
        Converter::Impl::add((Impl *)instruction_local,pOVar10,false);
        pOVar11 = Converter::Impl::allocate((Impl *)instruction_local,OpSConvert,IVar4);
        Operation::add_id(pOVar11,pOVar10->id);
        Converter::Impl::add((Impl *)instruction_local,pOVar11,false);
        pOVar10 = Converter::Impl::allocate((Impl *)instruction_local,OpShiftLeftLogical,IVar4);
        Operation::add_id(pOVar10,pOVar9->id);
        Operation::add_id(pOVar10,pOVar11->id);
        Converter::Impl::add((Impl *)instruction_local,pOVar10,false);
        pCVar1 = instruction_local;
        if (rounded_layer._4_4_ == 0) {
          comp._4_4_ = pOVar8->id;
        }
        else {
          IVar4 = spv::Builder::makeVectorType(_image_id,component,bool_type);
          pOVar9 = Converter::Impl::allocate((Impl *)pCVar1,OpCompositeConstruct,IVar4);
          Operation::add_id(pOVar9,pOVar8->id);
          Operation::add_id(pOVar9,rounded_layer._4_4_);
          Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
          comp._4_4_ = pOVar9->id;
        }
        if ((int)instruction_local[1].super_Instruction.attachments._M_h._M_rehash_policy.
                 _M_next_resize == 4) {
          pOVar8 = Converter::Impl::allocate
                             ((Impl *)instruction_local,OpIsHelperInvocationEXT,IVar3);
          Converter::Impl::add((Impl *)instruction_local,pOVar8,false);
          pOVar9 = Converter::Impl::allocate((Impl *)instruction_local,OpLogicalNot,IVar3);
          Operation::add_id(pOVar9,pOVar8->id);
          Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
          is_helper._4_4_ = pOVar9->id;
          if (scaling.unnormalized_exponent_id != 0) {
            pOVar8 = Converter::Impl::allocate((Impl *)instruction_local,OpLogicalAnd,IVar3);
            Operation::add_id(pOVar8,is_helper._4_4_);
            Operation::add_id(pOVar8,lods.fine_lod_id);
            Converter::Impl::add((Impl *)instruction_local,pOVar8,false);
            is_helper._4_4_ = pOVar8->id;
          }
        }
        else if (scaling.unnormalized_exponent_id == 0) {
          is_helper._4_4_ = spv::Builder::makeBoolConstant(_image_id,true,false);
        }
        else {
          is_helper._4_4_ = lods.fine_lod_id;
        }
        if ((bool_type == 3) && ((_num_coords->non_uniform & 1U) != 0)) {
          call._4_4_ = AtomicImageArrayR64CompactNonUniform;
        }
        else if (bool_type == 3) {
          call._4_4_ = AtomicImageArrayR64Compact;
        }
        else if ((_num_coords->non_uniform & 1U) == 0) {
          call._4_4_ = AtomicImageR64Compact;
        }
        else {
          call._4_4_ = AtomicImageR64CompactNonUniform;
        }
        IVar4 = SPIRVModule::get_helper_call_id
                          ((SPIRVModule *)
                           (instruction_local->super_Instruction).super_Value.tween_id,call._4_4_,0)
        ;
        pCVar1 = instruction_local;
        IVar5 = spv::Builder::makeVoidType(_image_id);
        pOVar8 = Converter::Impl::allocate((Impl *)pCVar1,OpFunctionCall,IVar5);
        Operation::add_id(pOVar8,IVar4);
        Operation::add_id(pOVar8,_num_coords->var_id);
        Operation::add_id(pOVar8,comp._4_4_);
        Operation::add_id(pOVar8,pOVar10->id);
        Operation::add_id(pOVar8,is_helper._4_4_);
        Converter::Impl::add((Impl *)instruction_local,pOVar8,false);
      }
      impl_local._7_1_ = true;
    }
    else {
      impl_local._7_1_ = false;
    }
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_write_sampler_feedback_instruction(DXIL::Op opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	builder.addCapability(spv::CapabilityImageQuery);
	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	spv::Id feedback_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(2));
	spv::Id sampler_id = impl.get_id_for_value(instruction->getOperand(3));
	const auto &meta = impl.handle_to_resource_meta[feedback_id];

	uint32_t num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	// Should not happen.
	if (num_coords != 2)
		return false;

	spv::Id bool_type = builder.makeBoolType();
	spv::Id i32_type = builder.makeIntType(32);
	spv::Id f32_type = builder.makeFloatType(32);
	spv::Id bvec_type = builder.makeVectorType(bool_type, 2);
	spv::Id ivec_type = builder.makeVectorType(i32_type, 2);
	spv::Id fvec_type = builder.makeVectorType(f32_type, 2);

	spv::Id int_layer_id = 0;
	if (num_coords_full == 3)
	{
		// Vulkan allows for two implementation of this rounding, either RTE or floor(v + 0.5).
		// Pick the suggested one. This matches real-world implementations.
		auto *rounded_layer = impl.allocate(spv::OpExtInst, f32_type);
		rounded_layer->add_id(impl.glsl_std450_ext);
		rounded_layer->add_literal(GLSLstd450RoundEven);
		rounded_layer->add_id(impl.get_id_for_value(instruction->getOperand(6)));
		impl.add(rounded_layer);

		auto *int_layer = impl.allocate(spv::OpConvertFToS, i32_type);
		int_layer->add_id(rounded_layer->id);
		impl.add(int_layer);

		int_layer_id = int_layer->id;
	}

	spv::Id coord_ids[2];
	for (uint32_t i = 0; i < 2; i++)
		coord_ids[i] = impl.get_id_for_value(instruction->getOperand(4 + i));
	spv::Id coord_id = impl.build_vector(f32_type, coord_ids, 2);
	spv::Id mip_region_size_log2 = emit_mip_region_size_log2(impl, instruction, feedback_id, num_coords_full == 3);
	spv::Id max_level_id = emit_max_level(impl, image_id);

	// This part will change quite dramatically based on op-code.
	// Computing the actual LOD to access is quite painful.
	// We cannot do it properly for most interesting cases without having side band information
	// about sampler state. In real-world scenarios, applications will likely adhere to whatever mip level
	// we decide to access either way, so it shouldn't lead to serious problems.
	spv::Id grad_scale_id;
	spv::Id access_lod_id = emit_accessed_lod(opcode, impl, instruction, image_id, sampler_id, coord_id,
	                                          max_level_id, &grad_scale_id, num_coords_full == 3);

	auto lods = emit_trilinear_lods(impl, access_lod_id, max_level_id);

	spv::Id normalized_grad_extent = 0;
	if (opcode == DXIL::Op::WriteSamplerFeedback || opcode == DXIL::Op::WriteSamplerFeedbackBias)
		normalized_grad_extent = emit_gradient_extent_normalized(impl, coord_id, grad_scale_id);

	// Assume that if we get coordinates above 1.0 we intend to WRAP.
	// Only WRAP and CLAMP is supported with sampler feedback (but WRAP is kinda broken on NV hardware).
	// After wrap, assume CLAMP semantics for purposes of filtering.
	auto *fract_uv_op = impl.allocate(spv::OpExtInst, fvec_type);
	fract_uv_op->add_id(impl.glsl_std450_ext);
	fract_uv_op->add_literal(GLSLstd450Fract);
	fract_uv_op->add_id(coord_id);
	impl.add(fract_uv_op);

	for (unsigned lod_iteration = 0; lod_iteration < 2; lod_iteration++)
	{
		spv::Id lod_id = lod_iteration ? lods.coarse_lod_id : lods.fine_lod_id;

		auto scaling = emit_scaling_factor_to_mip_region_space(
			impl, instruction, image_id, lod_id,
			mip_region_size_log2, num_coords_full == 3);

		auto *mul_mip_region_coord = impl.allocate(spv::OpFMul, fvec_type);
		mul_mip_region_coord->add_id(fract_uv_op->id);
		mul_mip_region_coord->add_id(scaling.normalized_scale_id);
		impl.add(mul_mip_region_coord);

		// We have to assume the worst w.r.t. filtering / aniso.
		// Simplify this with a ton with crude, but effective approximations.
		// Compute derivatives in mip region space.
		// Based on these derivatives, we get a bounding box.
		// The size of this bounding box is then clamped to a minimum and maximum size.
		// At minimum, we have 1x aniso / bilinear. Extent is +/- 0.5 texels.
		// At maximum, we have 16x aniso. Extent is +/- 8 texels.
		// Need to look at derivatives so that we can compute conservative aniso extent.

		// For implicit LOD, we compute the gradient and try to recover aniso information.
		spv::Id clamped_extent_id;

		if (opcode == DXIL::Op::WriteSamplerFeedback || opcode == DXIL::Op::WriteSamplerFeedbackBias)
		{
			auto *scale_size = impl.allocate(spv::OpFMul, fvec_type);
			scale_size->add_id(normalized_grad_extent);
			scale_size->add_id(scaling.float_size_id);
			impl.add(scale_size);

			// For integer LODs, we will end up computing an approximate integer due to FP derivatives.
			// It would be very bad if we got a positive error and rounded up a full POT.
			// LODs tend to be snapped to fixed point, so use a sufficient threshold to avoid these errors.
			// This value is chosen somewhat arbitrarily, but one subtexel worth of bias seems reasonable.
			auto *rounding_bias = impl.allocate(spv::OpFSub, fvec_type);
			rounding_bias->add_id(scale_size->id);
			rounding_bias->add_id(
				impl.build_splat_constant_vector(f32_type, builder.makeFloatConstant(1.0f / 256.0f), 2));
			impl.add(rounding_bias);

			// With aniso factors, implementations are allowed to round up the aniso factor
			// to nearest supported value.
			// From exhaustive testing, NV and Intel have somewhat different behavior, but in general,
			// all POT factors behave accurately with this implementation.
			// Oddly enough, the extent is enlongated as well when rounding up, which is also not spec compliant ...
			// What we want to do is round up to next POT and round up extent similarly,
			// and the cutest way to do this is with frexp. The exponent represents next POT in magnitude.
			// We can then clamp that frexp to [unormalized_exponent_id, unnormalized_exponent_id + 4].
			// We're robust against NaN since the exponent is undefined, but we'll clamp that below in integer space.
			auto *frexp = impl.allocate(spv::OpExtInst, builder.makeStructResultType(fvec_type, ivec_type));
			frexp->add_id(impl.glsl_std450_ext);
			frexp->add_literal(GLSLstd450FrexpStruct);
			frexp->add_id(rounding_bias->id);
			impl.add(frexp);

			auto *extract = impl.allocate(spv::OpCompositeExtract, ivec_type);
			extract->add_id(frexp->id);
			extract->add_literal(1);
			impl.add(extract);

			auto *sclamp = impl.allocate(spv::OpExtInst, ivec_type);
			sclamp->add_id(impl.glsl_std450_ext);
			sclamp->add_literal(GLSLstd450SClamp);
			sclamp->add_id(extract->id);
			sclamp->add_id(impl.build_splat_constant_vector(i32_type, builder.makeIntConstant(0), num_coords));
			sclamp->add_id(impl.build_splat_constant_vector(i32_type, builder.makeIntConstant(4), num_coords));
			impl.add(sclamp);

			auto *shift_exp = impl.allocate(spv::OpIAdd, ivec_type);
			shift_exp->add_id(sclamp->id);
			shift_exp->add_id(scaling.unnormalized_exponent_id);
			impl.add(shift_exp);

			// For aniso, the conservative filter extent is half the major length.
			// Halve the bounding box extents as a rough approximation.
			// For bilinear, the footprint can be found in [-0.5, 0.5] texels.
			// Fuse the multiply and exp2() here in ldexp.
			auto *fextent = impl.allocate(spv::OpExtInst, fvec_type);
			fextent->add_id(impl.glsl_std450_ext);
			fextent->add_literal(GLSLstd450Ldexp);
			fextent->add_id(impl.build_splat_constant_vector(f32_type, builder.makeFloatConstant(0.5f), num_coords));
			fextent->add_id(shift_exp->id);
			impl.add(fextent);

			// We only support signalling access for nearest neighbor.
			// For 16x aniso with 4x4 region, this can go wrong, but we don't really care.
			// Worst case, we can clamp to 16x16 region internally and upsample the region map on resolve.
			// Maximum +/- 0.5 regions is allowed here, this ensures that we access maximum 2x2 blocks.
			auto *clamped_extent = impl.allocate(spv::OpExtInst, fvec_type);
			clamped_extent->add_id(impl.glsl_std450_ext);
			clamped_extent->add_literal(GLSLstd450FMin);
			clamped_extent->add_id(fextent->id);
			clamped_extent->add_id(
				impl.build_splat_constant_vector(f32_type, builder.makeFloatConstant(0.5f), num_coords));
			impl.add(clamped_extent);

			clamped_extent_id = clamped_extent->id;
		}
		else
		{
			// Level is incompatible with aniso, so always assume simple bilinear. Use fixed +/- 0.5 pixel footprint.
			// For explicit gradient, we also assume no aniso,
			// since computing aniso-factors can cause far too fine mips to be requested if this was not intended by app.
			// We have no good way to detect this, and trying to compute aniso factors
			// accurately to hardware is a losing game since every implementation applies heavy approximations.
			auto *min_extent = impl.allocate(spv::OpExtInst, fvec_type);
			min_extent->add_id(impl.glsl_std450_ext);
			min_extent->add_literal(GLSLstd450Ldexp);
			min_extent->add_id(impl.build_splat_constant_vector(f32_type, builder.makeFloatConstant(0.5f), num_coords));
			min_extent->add_id(scaling.unnormalized_exponent_id);
			impl.add(min_extent);

			clamped_extent_id = min_extent->id;
		}

		auto *lo_foot_print = impl.allocate(spv::OpFSub, fvec_type);
		lo_foot_print->add_id(mul_mip_region_coord->id);
		lo_foot_print->add_id(clamped_extent_id);
		impl.add(lo_foot_print);

		auto *lo_clamped = impl.allocate(spv::OpExtInst, fvec_type);
		lo_clamped->add_id(impl.glsl_std450_ext);
		lo_clamped->add_literal(GLSLstd450FMax);
		lo_clamped->add_id(lo_foot_print->id);
		lo_clamped->add_id(impl.build_splat_constant_vector(f32_type, builder.makeFloatConstant(0.0f), num_coords));
		impl.add(lo_clamped);

		auto *hi_foot_print = impl.allocate(spv::OpFAdd, fvec_type);
		hi_foot_print->add_id(mul_mip_region_coord->id);
		hi_foot_print->add_id(clamped_extent_id);
		impl.add(hi_foot_print);

		auto *lo_int = impl.allocate(spv::OpConvertFToS, ivec_type);
		lo_int->add_id(lo_clamped->id);
		impl.add(lo_int);

		auto *hi_int = impl.allocate(spv::OpConvertFToS, ivec_type);
		hi_int->add_id(hi_foot_print->id);
		impl.add(hi_int);

		auto *not_equal = impl.allocate(spv::OpINotEqual, bvec_type);
		not_equal->add_id(lo_int->id);
		not_equal->add_id(hi_int->id);
		impl.add(not_equal);

		auto *visit_horiz = impl.allocate(spv::OpCompositeExtract, bool_type);
		visit_horiz->add_id(not_equal->id);
		visit_horiz->add_literal(0);
		impl.add(visit_horiz);

		auto *visit_vert = impl.allocate(spv::OpCompositeExtract, bool_type);
		visit_vert->add_id(not_equal->id);
		visit_vert->add_literal(1);
		impl.add(visit_vert);

		auto *visit_diag = impl.allocate(spv::OpLogicalAnd, bool_type);
		visit_diag->add_id(visit_horiz->id);
		visit_diag->add_id(visit_vert->id);
		impl.add(visit_diag);

		const spv::Id bit_ids[3] = {visit_horiz->id, visit_vert->id, visit_diag->id};
		spv::Id merged_bit = builder.makeIntConstant(1);

		for (unsigned i = 0; i < 3; i++)
		{
			auto *select_op = impl.allocate(spv::OpSelect, i32_type);
			select_op->add_id(bit_ids[i]);
			select_op->add_id(builder.makeIntConstant(2 << i));
			select_op->add_id(builder.makeIntConstant(0));
			impl.add(select_op);

			auto *or_op = impl.allocate(spv::OpBitwiseOr, i32_type);
			or_op->add_id(merged_bit);
			or_op->add_id(select_op->id);
			impl.add(or_op);

			merged_bit = or_op->id;
		}

		spv::Id u64_type = builder.makeUintType(64);
		auto *u64_conv = impl.allocate(spv::OpSConvert, u64_type);
		u64_conv->add_id(merged_bit);
		impl.add(u64_conv);

		auto *shamt = impl.allocate(spv::OpIMul, i32_type);
		shamt->add_id(lod_id);
		shamt->add_id(builder.makeIntConstant(4));
		impl.add(shamt);

		auto *shamt64 = impl.allocate(spv::OpSConvert, u64_type);
		shamt64->add_id(shamt->id);
		impl.add(shamt64);

		auto *shift_op = impl.allocate(spv::OpShiftLeftLogical, u64_type);
		shift_op->add_id(u64_conv->id);
		shift_op->add_id(shamt64->id);
		impl.add(shift_op);

		spv::Id comp_id;
		if (int_layer_id)
		{
			auto *comp = impl.allocate(spv::OpCompositeConstruct, builder.makeVectorType(i32_type, num_coords_full));
			comp->add_id(lo_int->id);
			comp->add_id(int_layer_id);
			impl.add(comp);
			comp_id = comp->id;
		}
		else
		{
			comp_id = lo_int->id;
		}

		spv::Id participate_id;
		if (impl.execution_model == spv::ExecutionModelFragment)
		{
			auto *is_helper = impl.allocate(spv::OpIsHelperInvocationEXT, bool_type);
			impl.add(is_helper);

			auto *not_op = impl.allocate(spv::OpLogicalNot, bool_type);
			not_op->add_id(is_helper->id);
			impl.add(not_op);

			participate_id = not_op->id;

			if (lod_iteration != 0)
			{
				auto *trilinear_and = impl.allocate(spv::OpLogicalAnd, bool_type);
				trilinear_and->add_id(participate_id);
				trilinear_and->add_id(lods.trilinear_enable_id);
				impl.add(trilinear_and);
				participate_id = trilinear_and->id;
			}
		}
		else
		{
			if (lod_iteration == 0)
				participate_id = builder.makeBoolConstant(true);
			else
				participate_id = lods.trilinear_enable_id;
		}

		HelperCall helper_call;
		if (num_coords_full == 3 && meta.non_uniform)
			helper_call = HelperCall::AtomicImageArrayR64CompactNonUniform;
		else if (num_coords_full == 3)
			helper_call = HelperCall::AtomicImageArrayR64Compact;
		else if (meta.non_uniform)
			helper_call = HelperCall::AtomicImageR64CompactNonUniform;
		else
			helper_call = HelperCall::AtomicImageR64Compact;

		spv::Id call_id = impl.spirv_module.get_helper_call_id(helper_call);
		auto *call = impl.allocate(spv::OpFunctionCall, builder.makeVoidType());
		call->add_id(call_id);
		call->add_id(meta.var_id);
		call->add_id(comp_id);
		call->add_id(shift_op->id);
		call->add_id(participate_id);
		impl.add(call);
	}

	return true;
}